

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelUri.cpp
# Opt level: O0

string * __thiscall
aeron::archive::ChannelUri::toString_abi_cxx11_(string *__return_storage_ptr__,ChannelUri *this)

{
  bool bVar1;
  ulong uVar2;
  reference pcVar3;
  ostream *poVar4;
  reference pvVar5;
  char *pcVar6;
  value_type *p;
  const_iterator __end3;
  const_iterator __begin3;
  ParamsMap *__range3;
  size_t ps;
  ostringstream local_190 [8];
  ostringstream ss;
  ChannelUri *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::operator<<((ostream *)local_190,(string *)this);
    std::__cxx11::string::rbegin();
    pcVar3 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&ps);
    if (*pcVar3 != ':') {
      std::operator<<((ostream *)local_190,':');
    }
  }
  poVar4 = std::operator<<((ostream *)local_190,
                           (string *)(anonymous_namespace)::AERON_PREFIX_abi_cxx11_);
  std::operator<<(poVar4,(string *)&this->media_);
  bVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&this->params_);
  if (!bVar1) {
    std::operator<<((ostream *)local_190,'?');
    __range3 = (ParamsMap *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::size(&this->params_);
    __end3 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(&this->params_);
    p = (value_type *)
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::end(&this->params_);
    while (bVar1 = std::__detail::operator!=
                             (&__end3.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                              ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                *)&p), bVar1) {
      pvVar5 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
               ::operator*(&__end3);
      poVar4 = std::operator<<((ostream *)local_190,(string *)pvVar5);
      poVar4 = std::operator<<(poVar4,'=');
      poVar4 = std::operator<<(poVar4,(string *)&pvVar5->second);
      __range3 = (ParamsMap *)((long)&__range3[-1]._M_h._M_single_bucket + 7);
      pcVar6 = "";
      if (__range3 != (ParamsMap *)0x0) {
        pcVar6 = "|";
      }
      std::operator<<(poVar4,pcVar6);
      std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
      ::operator++(&__end3);
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string ChannelUri::toString() const {
    std::ostringstream ss;

    if (!prefix_.empty()) {
        ss << prefix_;
        if (':' != *prefix_.rbegin()) {
            ss << ':';
        }
    }

    ss << AERON_PREFIX << media_;

    if (!params_.empty()) {
        ss << '?';

        std::size_t ps = params_.size();

        for (const auto& p : params_) {
            ss << p.first << '=' << p.second << (--ps ? "|" : "");
        }
    }

    return ss.str();
}